

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperFloatingPointEQ<double>
          (internal *this,char *expected_expression,char *actual_expression,double expected,
          double actual)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  FloatingPoint<double> rhs;
  FloatingPoint<double> lhs;
  stringstream actual_ss;
  stringstream expected_ss;
  String local_358;
  String local_348;
  FloatingPointUnion local_338;
  FloatingPointUnion local_330;
  stringstream local_328 [16];
  long local_318;
  undefined8 auStack_310 [46];
  stringstream local_1a0 [16];
  long local_190;
  undefined8 auStack_188 [46];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  local_338.value_ = actual;
  local_330.value_ = expected;
  bVar1 = FloatingPoint<double>::AlmostEquals
                    ((FloatingPoint<double> *)&local_330,(FloatingPoint<double> *)&local_338);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    *(undefined8 *)((long)auStack_188 + *(long *)(local_190 + -0x18)) = 0x11;
    std::ostream::_M_insert<double>(expected);
    std::__cxx11::stringstream::stringstream(local_328);
    *(undefined8 *)((long)auStack_310 + *(long *)(local_318 + -0x18)) = 0x11;
    std::ostream::_M_insert<double>(actual);
    StringStreamToString((internal *)&local_348,(stringstream *)local_1a0);
    StringStreamToString((internal *)&local_358,(stringstream *)local_328);
    EqFailure(this,expected_expression,actual_expression,&local_348,&local_358,false);
    String::~String(&local_358);
    String::~String(&local_348);
    std::__cxx11::stringstream::~stringstream(local_328);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperFloatingPointEQ(const char* expected_expression,
                                         const char* actual_expression,
                                         RawType expected,
                                         RawType actual) {
  const FloatingPoint<RawType> lhs(expected), rhs(actual);

  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  ::std::stringstream expected_ss;
  expected_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
              << expected;

  ::std::stringstream actual_ss;
  actual_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
            << actual;

  return EqFailure(expected_expression,
                   actual_expression,
                   StringStreamToString(&expected_ss),
                   StringStreamToString(&actual_ss),
                   false);
}